

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_help.cpp
# Opt level: O1

void __thiscall Help_BuildTwoCategories_Test::TestBody(Help_BuildTwoCategories_Test *this)

{
  _List_node_base *p_Var1;
  long lVar2;
  pointer *__ptr;
  char *pcVar3;
  initializer_list<pstore::command_line::option_*> __l;
  AssertionResult gtest_ar;
  options_container container;
  option_category category;
  categories_collection actual;
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  option3;
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  option2;
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  option1;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_308;
  allocator_type local_300 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2f8;
  AssertHelper local_2f0;
  list<pstore::command_line::option_*,_std::allocator<pstore::command_line::option_*>_> local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2d0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0;
  undefined1 local_2b0 [16];
  _Base_ptr local_2a0;
  _Rb_tree_node_base *local_298;
  opt<std::__cxx11::string,pstore::command_line::parser<std::__cxx11::string,void>> *local_288;
  undefined1 local_280 [200];
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  local_1b8;
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  local_f0;
  
  pstore::command_line::
  opt<std::__cxx11::string,pstore::command_line::parser<std::__cxx11::string,void>>::
  opt<char[5],pstore::command_line::details::positional>
            ((opt<std::__cxx11::string,pstore::command_line::parser<std::__cxx11::string,void>> *)
             &local_f0,(char (*) [5])"arg1",(positional *)&pstore::command_line::positional);
  pstore::command_line::
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  ::opt<char[5]>(&local_1b8,(char (*) [5])"arg2");
  local_280._0_8_ = local_280 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"category","");
  pstore::command_line::option_category::option_category
            ((option_category *)local_2d0,(string *)local_280);
  if ((undefined1 *)local_280._0_8_ != local_280 + 0x10) {
    operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
  }
  local_2b0._0_8_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0;
  pstore::command_line::
  opt<std::__cxx11::string,pstore::command_line::parser<std::__cxx11::string,void>>::
  opt<char[5],pstore::command_line::details::category>
            ((opt<std::__cxx11::string,pstore::command_line::parser<std::__cxx11::string,void>> *)
             local_280,(char (*) [5])"arg3",(category *)local_2b0);
  __l._M_len = 3;
  __l._M_array = (iterator)local_2b0;
  local_2b0._0_8_ = &local_f0;
  local_2b0._8_8_ = &local_1b8;
  local_2a0 = (_Base_ptr)local_280;
  std::__cxx11::
  list<pstore::command_line::option_*,_std::allocator<pstore::command_line::option_*>_>::list
            (&local_2e8,__l,local_300);
  pstore::command_line::details::build_categories
            ((categories_collection *)local_2b0,(option *)0x0,(options_container *)&local_2e8);
  local_308._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288;
  local_2f0.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)local_300,"actual.size ()","2U",(unsigned_long *)&local_308,
             (uint *)&local_2f0);
  if (local_300[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)&local_308);
    if (local_2f8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_2f8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2f0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_help.cpp"
               ,0x5f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2f0,(Message *)&local_308);
  }
  else {
    if (local_2f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_2f8,local_2f8);
    }
    local_308._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::internal::CmpHelperEQ<pstore::command_line::option_category_const*,decltype(nullptr)>
              ((internal *)local_300,"it->first","nullptr",(option_category **)(local_298 + 1),
               &local_308._M_head_impl);
    if (local_300[0] == (allocator_type)0x0) {
      testing::Message::Message((Message *)&local_308);
      if (local_2f8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = (local_2f8->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_2f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_help.cpp"
                 ,0x61,pcVar3);
      testing::internal::AssertHelper::operator=(&local_2f0,(Message *)&local_308);
      testing::internal::AssertHelper::~AssertHelper(&local_2f0);
      if (local_308._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_308._M_head_impl + 8))();
      }
    }
    if (local_2f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_2f8,local_2f8);
    }
    local_308._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1b8;
    testing::internal::
    PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<pstore::command_line::opt<std::__cxx11::string,pstore::command_line::parser<std::__cxx11::string,void>>*>>>
    ::operator()(local_300,(char *)&local_308,
                 (set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>
                  *)"it->second");
    if (local_300[0] == (allocator_type)0x0) {
      testing::Message::Message((Message *)&local_308);
      if (local_2f8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = (local_2f8->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_2f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_help.cpp"
                 ,0x62,pcVar3);
      testing::internal::AssertHelper::operator=(&local_2f0,(Message *)&local_308);
      testing::internal::AssertHelper::~AssertHelper(&local_2f0);
      if ((opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
           *)local_308._M_head_impl !=
          (opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
           *)0x0) {
        (**(code **)(*(long *)local_308._M_head_impl + 8))();
      }
    }
    if (local_2f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_2f8,local_2f8);
    }
    lVar2 = std::_Rb_tree_increment(local_298);
    local_308._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0;
    testing::internal::
    CmpHelperEQ<pstore::command_line::option_category_const*,pstore::command_line::option_category*>
              ((internal *)local_300,"it->first","&category",(option_category **)(lVar2 + 0x20),
               (option_category **)&local_308);
    if (local_300[0] == (allocator_type)0x0) {
      testing::Message::Message((Message *)&local_308);
      if (local_2f8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = (local_2f8->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_2f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_help.cpp"
                 ,100,pcVar3);
      testing::internal::AssertHelper::operator=(&local_2f0,(Message *)&local_308);
      testing::internal::AssertHelper::~AssertHelper(&local_2f0);
      if (local_308._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_308._M_head_impl + 8))();
      }
    }
    if (local_2f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_2f8,local_2f8);
    }
    local_308._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280;
    testing::internal::
    PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<pstore::command_line::opt<std::__cxx11::string,pstore::command_line::parser<std::__cxx11::string,void>>*>>>
    ::operator()(local_300,(char *)&local_308,
                 (set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>
                  *)"it->second");
    if (local_300[0] != (allocator_type)0x0) goto LAB_00137724;
    testing::Message::Message((Message *)&local_308);
    if (local_2f8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_2f8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_help.cpp"
               ,0x65,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2f0,(Message *)&local_308);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_2f0);
  if (local_308._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_308._M_head_impl + 8))();
  }
LAB_00137724:
  if (local_2f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2f8,local_2f8);
  }
  std::
  _Rb_tree<const_pstore::command_line::option_category_*,_std::pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>,_std::_Select1st<std::pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>_>,_std::less<const_pstore::command_line::option_category_*>,_std::allocator<std::pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<const_pstore::command_line::option_category_*,_std::pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>,_std::_Select1st<std::pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>_>,_std::less<const_pstore::command_line::option_category_*>,_std::allocator<std::pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>_>_>
               *)local_2b0);
  while (local_2e8.
         super__List_base<pstore::command_line::option_*,_std::allocator<pstore::command_line::option_*>_>
         ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_2e8) {
    p_Var1 = (((_List_base<pstore::command_line::option_*,_std::allocator<pstore::command_line::option_*>_>
                *)&(local_2e8.
                    super__List_base<pstore::command_line::option_*,_std::allocator<pstore::command_line::option_*>_>
                    ._M_impl._M_node.super__List_node_base._M_next)->_M_next)->_M_impl)._M_node.
             super__List_node_base._M_next;
    operator_delete(local_2e8.
                    super__List_base<pstore::command_line::option_*,_std::allocator<pstore::command_line::option_*>_>
                    ._M_impl._M_node.super__List_node_base._M_next,0x18);
    local_2e8.
    super__List_base<pstore::command_line::option_*,_std::allocator<pstore::command_line::option_*>_>
    ._M_impl._M_node.super__List_node_base._M_next = p_Var1;
  }
  pstore::command_line::
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  ::~opt((opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
          *)local_280);
  if (local_2d0[0] != &local_2c0) {
    operator_delete(local_2d0[0],local_2c0._M_allocated_capacity + 1);
  }
  pstore::command_line::
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  ::~opt(&local_1b8);
  pstore::command_line::
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  ::~opt(&local_f0);
  return;
}

Assistant:

TEST_F (Help, BuildTwoCategories) {
    opt<std::string> option1{"arg1", positional};
    opt<std::string> option2{"arg2"};
    option_category category{"category"};
    opt<std::string> option3{"arg3", cat (category)};

    option::options_container container{&option1, &option2, &option3};
    details::categories_collection const actual = details::build_categories (nullptr, container);

    ASSERT_EQ (actual.size (), 2U);
    auto it = std::begin (actual);
    EXPECT_EQ (it->first, nullptr);
    EXPECT_THAT (it->second, testing::ElementsAre (&option2));
    ++it;
    EXPECT_EQ (it->first, &category);
    EXPECT_THAT (it->second, testing::ElementsAre (&option3));
}